

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O2

bool __thiscall
QPageLayout::setTopMargin(QPageLayout *this,qreal topMargin,OutOfBoundsPolicy outOfBoundsPolicy)

{
  double dVar1;
  QPageLayoutPrivate *pQVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  
  pQVar2 = (this->d).d.ptr;
  if ((outOfBoundsPolicy == Clamp) && (pQVar2->m_mode == StandardMode)) {
    dVar5 = (pQVar2->m_maxMargins).m_top;
    if (topMargin <= dVar5) {
      dVar5 = topMargin;
    }
    dVar1 = (pQVar2->m_minMargins).m_top;
    topMargin = dVar5;
    if (dVar5 <= dVar1) {
      topMargin = dVar1;
    }
  }
  bVar3 = qFuzzyCompare(topMargin,(pQVar2->m_margins).m_top);
  bVar4 = true;
  if (!bVar3) {
    pQVar2 = (this->d).d.ptr;
    if ((pQVar2->m_mode == FullPageMode) ||
       (((pQVar2->m_minMargins).m_top <= topMargin && (topMargin <= (pQVar2->m_maxMargins).m_top))))
    {
      QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach(&this->d);
      (((this->d).d.ptr)->m_margins).m_top = topMargin;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool QPageLayout::setTopMargin(qreal topMargin, OutOfBoundsPolicy outOfBoundsPolicy)
{
    if (d->m_mode == StandardMode && outOfBoundsPolicy == OutOfBoundsPolicy::Clamp)
        topMargin = qBound(d->m_minMargins.top(), topMargin, d->m_maxMargins.top());

    if (qFuzzyCompare(topMargin, d->m_margins.top()))
        return true;

    if (d->m_mode == FullPageMode
        || (topMargin >= d->m_minMargins.top() && topMargin <= d->m_maxMargins.top())) {
        d.detach();
        d->m_margins.setTop(topMargin);
        return true;
    }

    return false;
}